

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

void __thiscall QErrorMessage::showMessage(QErrorMessage *this,QString *message,QString *type)

{
  long lVar1;
  bool bVar2;
  QErrorMessagePrivate *pQVar3;
  QErrorMessagePrivate *in_RDX;
  QString *in_RSI;
  QErrorMessagePrivate *in_RDI;
  long in_FS_OFFSET;
  QErrorMessagePrivate *d;
  value_type *__x;
  QErrorMessagePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QErrorMessage *)0x748cb4);
  bVar2 = QErrorMessagePrivate::isMessageToBeShown(this_00,in_RSI,(QString *)in_RDX);
  if (bVar2) {
    __x = (value_type *)&pQVar3->pending;
    QString::QString((QString *)in_RDI,(QString *)__x);
    QString::QString((QString *)in_RDI,&__x->content);
    std::
    queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
    ::push((queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
            *)in_RDI,__x);
    QErrorMessagePrivate::Message::~Message((Message *)in_RDI);
    bVar2 = QWidget::isVisible((QWidget *)0x748d26);
    if ((!bVar2) && (bVar2 = QErrorMessagePrivate::nextPending(in_RDX), bVar2)) {
      QWidget::show((QWidget *)in_RDX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QErrorMessage::showMessage(const QString &message, const QString &type)
{
    Q_D(QErrorMessage);
    if (!d->isMessageToBeShown(message, type))
        return;
    d->pending.push({message, type});
    if (!isVisible() && d->nextPending())
        show();
}